

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O1

void __thiscall PRED<UF>::PerformLabeling(PRED<UF> *this)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  int *piVar5;
  Mat1b *pMVar6;
  long lVar7;
  long *plVar8;
  Mat1i *pMVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  char *pcVar22;
  uint *puVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  uint *puVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int local_158;
  int local_130;
  int local_110;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar5,piVar5[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar13 = (uint *)operator_new__((ulong)(((*(int *)&pMVar6->field_0xc -
                                            (*(int *)&pMVar6->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                           ((*(int *)&pMVar6->field_0x8 -
                                            (*(int *)&pMVar6->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                   << 2);
  UF::P_ = puVar13;
  *puVar13 = 0;
  UF::length_ = 1;
  iVar19 = *(int *)&pMVar6->field_0xc;
  lVar32 = (long)iVar19;
  uVar20 = *(uint *)&pMVar6->field_0x8;
  lVar7 = *(long *)&pMVar6->field_0x10;
  plVar8 = *(long **)&pMVar6->field_0x48;
  pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar16 = *(long *)&pMVar9->field_0x10;
  plVar10 = *(long **)&pMVar9->field_0x48;
  if (0 < lVar32) {
    uVar21 = 0;
    do {
      iVar18 = (int)uVar21;
      if (*(char *)(lVar7 + iVar18) != '\0') {
        puVar13[UF::length_] = UF::length_;
        uVar27 = UF::length_ + 1;
        *(uint *)(lVar16 + (long)iVar18 * 4) = UF::length_;
        UF::length_ = uVar27;
        if (iVar19 <= iVar18 + 1) break;
        uVar21 = (ulong)(iVar18 + 1);
        while (*(char *)(lVar7 + uVar21) != '\0') {
          *(undefined4 *)(lVar16 + uVar21 * 4) =
               *(undefined4 *)(lVar16 + (long)((int)uVar21 + -1) * 4);
          uVar21 = uVar21 + 1;
          if (iVar19 == (int)uVar21) goto LAB_00196ae5;
        }
      }
      uVar27 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar27;
    } while ((int)uVar27 < iVar19);
  }
LAB_00196ae5:
  if (1 < (int)uVar20) {
    lVar11 = *plVar8;
    lVar12 = *plVar10;
    lVar17 = lVar11 + 1 + lVar7;
    lVar37 = lVar16 + lVar12 + 4;
    uVar21 = 1;
    lVar31 = lVar7;
    lVar35 = lVar16;
    lVar24 = lVar16;
    do {
      lVar24 = lVar24 + lVar12;
      lVar2 = lVar7 + lVar11 * uVar21;
      pcVar22 = (char *)(lVar2 - lVar11);
      puVar34 = (uint *)(lVar12 * uVar21 + lVar16);
      puVar23 = (uint *)((long)puVar34 - lVar12);
      cVar4 = *(char *)(lVar7 + lVar11 * uVar21);
      local_110 = (int)(lVar32 + -1);
      if (local_110 == 0) {
        if (cVar4 != '\0') {
          if (*pcVar22 == '\0') {
            puVar13[UF::length_] = UF::length_;
            uVar27 = UF::length_ + 1;
            *puVar34 = UF::length_;
            UF::length_ = uVar27;
          }
          else {
            *puVar34 = *puVar23;
          }
        }
      }
      else {
        if (cVar4 == '\0') {
          uVar26 = 0;
          goto LAB_00196c7b;
        }
        if (*pcVar22 == '\0') {
          if (pcVar22[1] == '\0') {
            puVar13[UF::length_] = UF::length_;
            uVar27 = UF::length_ + 1;
            *puVar34 = UF::length_;
            UF::length_ = uVar27;
            local_130 = 0;
            goto LAB_00196e68;
          }
          *puVar34 = puVar23[1];
          uVar26 = 0;
          goto LAB_00196fba;
        }
        *puVar34 = *puVar23;
        uVar26 = 0;
LAB_00196ffa:
        local_158 = (int)uVar26;
        iVar19 = local_158 + 1;
        if (iVar19 < local_110) {
          lVar33 = (long)local_158;
          lVar15 = lVar37 + lVar33 * 4;
          lVar36 = 0;
          while( true ) {
            iVar19 = (int)(lVar33 + 1);
            if (*(char *)(lVar17 + lVar33 + lVar36) == '\0') {
              uVar27 = iVar19 + (int)lVar36;
              goto LAB_0019710d;
            }
            if (*(char *)(lVar31 + lVar33 + 1 + lVar36) == '\0') break;
            *(undefined4 *)(lVar15 + lVar36 * 4) =
                 *(undefined4 *)(lVar35 + lVar33 * 4 + 4 + lVar36 * 4);
            lVar36 = lVar36 + 1;
            if ((lVar33 - lVar32) + 2 + lVar36 == 0) {
              local_158 = local_158 + (int)lVar36;
              iVar19 = iVar19 + (int)lVar36;
              goto LAB_001970c4;
            }
          }
          uVar26 = lVar33 + 1 + lVar36;
          local_130 = (int)uVar26;
          local_158 = local_158 + (int)lVar36;
          iVar19 = local_158 + 2;
          if (pcVar22[iVar19] == '\0') {
            *(uint *)(lVar15 + lVar36 * 4) = puVar34[local_158];
            goto LAB_00196e68;
          }
          uVar27 = puVar34[local_158];
          do {
            uVar28 = uVar27;
            uVar29 = puVar23[iVar19];
            uVar27 = puVar13[uVar28];
          } while (puVar13[uVar28] < uVar28);
          do {
            uVar27 = uVar29;
            uVar29 = puVar13[uVar27];
          } while (puVar13[uVar27] < uVar27);
          uVar25 = (ulong)uVar27;
          if (uVar28 >= uVar27 && uVar28 != uVar27) {
            uVar25 = (ulong)uVar28;
          }
          if (uVar28 < uVar27) {
            uVar27 = uVar28;
          }
          puVar13[uVar25] = uVar27;
          *(uint *)(lVar15 + lVar36 * 4) = uVar27;
LAB_00196fba:
          lVar15 = (long)(int)uVar26;
          uVar26 = lVar15 + 1;
          cVar4 = *(char *)(lVar2 + 1 + lVar15);
          if (local_110 <= (int)uVar26) {
            if (cVar4 != '\0') {
              puVar34[lVar15 + 1] = puVar23[lVar15 + 1];
            }
            goto LAB_001971a2;
          }
          if (cVar4 == '\0') {
LAB_00196c7b:
            lVar36 = (long)(int)uVar26;
            lVar15 = lVar36 << 0x20;
            lVar33 = 0;
            do {
              lVar30 = lVar15;
              lVar14 = lVar30 >> 0x20;
              if (lVar32 + -1 <= lVar36 + lVar33 + 1) {
                lVar15 = lVar30 + 0x100000000 >> 0x20;
                if (*(char *)(lVar2 + lVar15) == '\0') goto LAB_001971a2;
                if (pcVar22[lVar15] == '\0') {
                  if (pcVar22[lVar14] == '\0') {
                    puVar13[UF::length_] = UF::length_;
                    uVar27 = UF::length_ + 1;
                    puVar34[lVar15] = UF::length_;
                    UF::length_ = uVar27;
                    goto LAB_001971a2;
                  }
                  uVar27 = puVar23[lVar14];
                }
                else {
                  uVar27 = puVar23[lVar15];
                }
                puVar34[lVar15] = uVar27;
                goto LAB_001971a2;
              }
              lVar1 = lVar33 + 1;
              pcVar3 = (char *)(lVar17 + lVar36 + lVar33);
              lVar15 = lVar30 + 0x100000000;
              lVar33 = lVar1;
            } while (*pcVar3 == '\0');
            uVar26 = (uVar26 & 0xffffffff) + lVar1;
            if (*(char *)(lVar1 + lVar31 + lVar36) != '\0') {
              *(undefined4 *)(lVar24 + lVar36 * 4 + lVar1 * 4) =
                   *(undefined4 *)(lVar36 * 4 + lVar35 + lVar1 * 4);
              goto LAB_00196ffa;
            }
            lVar15 = lVar30 + 0x200000000 >> 0x20;
            if (pcVar22[lVar15] == '\0') {
              if (pcVar22[lVar14] == '\0') {
                puVar13[UF::length_] = UF::length_;
                uVar27 = UF::length_ + 1;
                *(uint *)(lVar24 + lVar36 * 4 + lVar1 * 4) = UF::length_;
                UF::length_ = uVar27;
              }
              else {
                *(uint *)(lVar24 + lVar36 * 4 + lVar1 * 4) = puVar23[lVar14];
              }
              local_130 = (int)uVar26;
LAB_00196e68:
              iVar19 = local_130 + 1;
              if (local_110 <= iVar19) {
LAB_00196f1a:
                lVar15 = (long)iVar19;
                if (*(char *)(lVar2 + lVar15) != '\0') goto LAB_0019719a;
                goto LAB_001971a2;
              }
              lVar36 = (long)local_130;
              lVar30 = lVar36 << 0x20;
              lVar15 = lVar37 + lVar36 * 4;
              lVar33 = 0;
              while( true ) {
                iVar19 = (int)(lVar36 + 1);
                if (*(char *)(lVar17 + lVar36 + lVar33) == '\0') goto LAB_00196f36;
                if (*(char *)(lVar31 + lVar36 + 2 + lVar33) != '\0') break;
                *(undefined4 *)(lVar15 + lVar33 * 4) = *(undefined4 *)(lVar15 + -4 + lVar33 * 4);
                lVar30 = lVar30 + 0x100000000;
                lVar33 = lVar33 + 1;
                if ((lVar32 + -2) - lVar36 == lVar33) {
                  local_130 = local_130 + (int)lVar33;
                  iVar19 = iVar19 + (int)lVar33;
                  goto LAB_00196f1a;
                }
              }
              uVar27 = *(uint *)((long)puVar34 + (lVar30 >> 0x1e));
              do {
                uVar28 = uVar27;
                uVar27 = puVar13[uVar28];
              } while (puVar13[uVar28] < uVar28);
              uVar26 = lVar36 + 1 + lVar33;
              uVar27 = *(uint *)(lVar36 * 4 + lVar35 + 8 + lVar33 * 4);
              do {
                uVar29 = uVar27;
                uVar27 = puVar13[uVar29];
              } while (puVar13[uVar29] < uVar29);
              uVar27 = uVar29;
              if (uVar28 >= uVar29 && uVar28 != uVar29) {
                uVar27 = uVar28;
              }
              if (uVar28 < uVar29) {
                uVar29 = uVar28;
              }
              puVar13[uVar27] = uVar29;
              *(uint *)(lVar15 + lVar33 * 4) = uVar29;
            }
            else if (pcVar22[lVar14] == '\0') {
              *(uint *)(lVar24 + lVar36 * 4 + lVar1 * 4) = puVar23[lVar15];
            }
            else {
              uVar27 = puVar23[lVar14];
              do {
                uVar29 = uVar27;
                uVar27 = puVar13[uVar29];
                uVar28 = puVar23[lVar15];
              } while (puVar13[uVar29] < uVar29);
              do {
                uVar27 = uVar28;
                uVar28 = puVar13[uVar27];
              } while (puVar13[uVar27] < uVar27);
              uVar28 = uVar27;
              if (uVar29 >= uVar27 && uVar29 != uVar27) {
                uVar28 = uVar29;
              }
              if (uVar29 < uVar27) {
                uVar27 = uVar29;
              }
              puVar13[uVar28] = uVar27;
              *(uint *)(lVar24 + lVar36 * 4 + lVar1 * 4) = uVar27;
            }
            goto LAB_00196fba;
          }
          puVar34[lVar15 + 1] = puVar23[lVar15 + 1];
          goto LAB_00196ffa;
        }
LAB_001970c4:
        lVar15 = (long)iVar19;
        if (*(char *)(lVar2 + lVar15) != '\0') {
          local_130 = local_158;
          if (pcVar22[lVar15] == '\0') {
LAB_0019719a:
            uVar27 = puVar34[local_130];
          }
          else {
            uVar27 = puVar23[lVar15];
          }
          puVar34[lVar15] = uVar27;
        }
      }
LAB_001971a2:
      uVar21 = uVar21 + 1;
      lVar35 = lVar35 + lVar12;
      lVar31 = lVar31 + lVar11;
      lVar17 = lVar17 + lVar11;
      lVar37 = lVar37 + lVar12;
    } while (uVar21 != uVar20);
  }
  uVar21 = (ulong)UF::length_;
  uVar20 = 1;
  if (1 < uVar21) {
    uVar26 = 1;
    do {
      if (puVar13[uVar26] < uVar26) {
        puVar13[uVar26] = puVar13[puVar13[uVar26]];
      }
      else {
        puVar13[uVar26] = uVar20;
        uVar20 = uVar20 + 1;
      }
      uVar26 = uVar26 + 1;
    } while (uVar21 != uVar26);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar20;
  if (0 < *(int *)&pMVar9->field_0x8) {
    lVar7 = *plVar10;
    lVar32 = 0;
    do {
      iVar19 = *(int *)&pMVar9->field_0xc;
      if ((long)iVar19 != 0) {
        lVar17 = 0;
        do {
          *(uint *)(lVar16 + lVar17) = puVar13[*(uint *)(lVar16 + lVar17)];
          lVar17 = lVar17 + 4;
        } while ((long)iVar19 * 4 != lVar17);
      }
      lVar32 = lVar32 + 1;
      lVar16 = lVar16 + lVar7;
    } while (lVar32 < *(int *)&pMVar9->field_0x8);
  }
  operator_delete__(puVar13);
  return;
LAB_00196f36:
  uVar27 = iVar19 + (int)lVar33;
LAB_0019710d:
  uVar26 = (ulong)uVar27;
  goto LAB_00196c7b;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }